

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O1

bitwidth_t __thiscall slang::SVInt::countLeadingOnesSlowCase(SVInt *this)

{
  uint64_t *puVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  byte bVar6;
  bitwidth_t bVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  bitwidth_t bVar11;
  uint uVar12;
  
  uVar8 = (this->super_SVIntStorage).bitWidth;
  uVar12 = uVar8 & 0x3f;
  uVar8 = (uVar8 + 0x3f >> 6) << ((this->super_SVIntStorage).unknownFlag & 0x1fU);
  bVar6 = 0x40 - (char)uVar12;
  bVar11 = 0x40;
  if (uVar12 != 0) {
    bVar11 = uVar12;
  }
  puVar1 = (this->super_SVIntStorage).field_0.pVal;
  if (uVar12 == 0) {
    bVar6 = 0;
  }
  uVar4 = puVar1[(ulong)uVar8 - 1] << (bVar6 & 0x3f) ^ 0xffffffffffffffff;
  if (uVar4 == 0) {
    uVar5 = 0x40;
  }
  else {
    uVar5 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> uVar5 == 0; uVar5 = uVar5 - 1) {
      }
    }
    uVar5 = uVar5 ^ 0x3f;
  }
  bVar7 = (bitwidth_t)uVar5;
  if (1 < uVar8 && bVar11 == bVar7) {
    bVar7 = (uVar8 * 0x40 + bVar7) - 0x40;
    iVar9 = uVar8 - 1;
    do {
      uVar4 = puVar1[iVar9 - 1];
      if (uVar4 != 0xffffffffffffffff) {
        uVar4 = uVar4 ^ 0xffffffffffffffff;
        if (uVar4 == 0) {
          uVar8 = 0x40;
        }
        else {
          lVar3 = 0x3f;
          if (uVar4 != 0) {
            for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
            }
          }
          uVar8 = (uint)lVar3 ^ 0x3f;
        }
        return uVar8 + (int)uVar5;
      }
      uVar5 = (ulong)((int)uVar5 + 0x40);
      iVar10 = iVar9 + -1;
      bVar2 = 0 < iVar9;
      iVar9 = iVar10;
    } while (iVar10 != 0 && bVar2);
  }
  return bVar7;
}

Assistant:

bitwidth_t SVInt::countLeadingOnesSlowCase() const {
    bitwidth_t bitsInMsw = bitWidth % BITS_PER_WORD;
    uint32_t shift = 0;
    if (!bitsInMsw)
        bitsInMsw = BITS_PER_WORD;
    else
        shift = BITS_PER_WORD - bitsInMsw;

    int i = int(getNumWords() - 1);
    bitwidth_t count = (bitwidth_t)std::countl_one(pVal[i] << shift);
    if (count == bitsInMsw) {
        for (i--; i >= 0; i--) {
            if (pVal[i] == UINT64_MAX)
                count += BITS_PER_WORD;
            else {
                count += (bitwidth_t)std::countl_one(pVal[i]);
                break;
            }
        }
    }

    return count;
}